

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O3

void duckdb_mbedtls::MbedTlsWrapper::Hmac256
               (char *key,size_t key_len,char *message,size_t message_len,char *out)

{
  int iVar1;
  mbedtls_md_info_t *md_info;
  runtime_error *this;
  mbedtls_md_context_t hmac_ctx;
  mbedtls_md_context_t local_40;
  
  md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
  if (md_info == (mbedtls_md_info_t *)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"failed to init hmac");
  }
  else {
    iVar1 = mbedtls_md_setup(&local_40,md_info,1);
    if (iVar1 == 0) {
      iVar1 = mbedtls_md_hmac_starts(&local_40,(uchar *)key,key_len);
      if (iVar1 == 0) {
        iVar1 = mbedtls_md_hmac_update(&local_40,(uchar *)message,message_len);
        if (iVar1 == 0) {
          iVar1 = mbedtls_md_hmac_finish(&local_40,(uchar *)out);
          if (iVar1 == 0) {
            mbedtls_md_free(&local_40);
            return;
          }
        }
      }
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"HMAC256 Error");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MbedTlsWrapper::Hmac256(const char *key, size_t key_len, const char *message, size_t message_len, char *out) {
	mbedtls_md_context_t hmac_ctx;
	const mbedtls_md_info_t *md_type = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
	if (!md_type) {
		throw runtime_error("failed to init hmac");
	}

	if (mbedtls_md_setup(&hmac_ctx, md_type, 1) ||
	    mbedtls_md_hmac_starts(&hmac_ctx, reinterpret_cast<const unsigned char *>(key), key_len) ||
	    mbedtls_md_hmac_update(&hmac_ctx, reinterpret_cast<const unsigned char *>(message), message_len) ||
	    mbedtls_md_hmac_finish(&hmac_ctx, reinterpret_cast<unsigned char *>(out))) {
		throw runtime_error("HMAC256 Error");
	}
	mbedtls_md_free(&hmac_ctx);
}